

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface.cc
# Opt level: O0

string * anon_unknown.dwarf_7c844::DirName(string *__return_storage_ptr__,string *path)

{
  char *pcVar1;
  bool bVar2;
  long local_20;
  size_type slash_pos;
  string *path_local;
  
  local_20 = std::__cxx11::string::find_last_of((char *)path,0x169293);
  if (local_20 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    while( true ) {
      bVar2 = false;
      if (local_20 != 0) {
        pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)path);
        pcVar1 = std::find<char_const*,char>("/","",pcVar1);
        bVar2 = pcVar1 != "";
      }
      if (!bVar2) break;
      local_20 = local_20 + -1;
    }
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)path);
  }
  return __return_storage_ptr__;
}

Assistant:

string DirName(const string& path) {
#ifdef _WIN32
  static const char kPathSeparators[] = "\\/";
#else
  static const char kPathSeparators[] = "/";
#endif
  static const char* const kEnd = kPathSeparators + sizeof(kPathSeparators) - 1;

  string::size_type slash_pos = path.find_last_of(kPathSeparators);
  if (slash_pos == string::npos)
    return string();  // Nothing to do.
  while (slash_pos > 0 &&
         std::find(kPathSeparators, kEnd, path[slash_pos - 1]) != kEnd)
    --slash_pos;
  return path.substr(0, slash_pos);
}